

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

string * __thiscall
libcellml::nodesCellMl1XVersion_abi_cxx11_
          (string *__return_storage_ptr__,libcellml *this,XmlNodePtr *node)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  bVar1 = XmlNode::isCellml10Element(*(XmlNode **)this,(char *)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar1) {
    pcVar3 = "1.0";
    pcVar2 = "";
  }
  else {
    pcVar3 = "1.1";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string nodesCellMl1XVersion(const XmlNodePtr &node)
{
    if (node->isCellml10Element()) {
        return "1.0";
    }

    return "1.1";
}